

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2.c
# Opt level: O1

ktx_error_code_e ktxTexture2_IterateLevels(ktxTexture2 *This,PFNKTXITERCB iterCb,void *userdata)

{
  ktxTexture2_private *pkVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  ktx_error_code_e kVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  
  kVar5 = KTX_INVALID_VALUE;
  if ((iterCb != (PFNKTXITERCB)0x0 && This != (ktxTexture2 *)0x0) &&
     (kVar5 = KTX_INVALID_OPERATION, This->supercompressionScheme == KTX_SS_BEGIN_RANGE)) {
    uVar4 = This->numLevels - 1;
    if ((int)uVar4 < 0) {
      kVar5 = KTX_SUCCESS;
    }
    else {
      pkVar1 = This->_private;
      lVar7 = (ulong)uVar4 * 0x18;
      uVar9 = (ulong)uVar4;
      do {
        bVar3 = (byte)uVar9;
        uVar6 = This->baseWidth >> (bVar3 & 0x1f);
        uVar4 = This->baseHeight >> (bVar3 & 0x1f);
        uVar8 = This->baseDepth >> (bVar3 & 0x1f);
        kVar5 = (*iterCb)((int)uVar9,0,uVar6 + (uVar6 == 0),uVar4 + (uVar4 == 0),
                          uVar8 + (uVar8 == 0),
                          *(ktx_uint64_t *)
                           ((long)&pkVar1->_levelIndex[0].uncompressedByteLength + lVar7),
                          This->pData +
                          *(long *)((long)&This->_private->_levelIndex[0].byteOffset + lVar7),
                          userdata);
        if (kVar5 != KTX_SUCCESS) {
          return kVar5;
        }
        lVar7 = lVar7 + -0x18;
        bVar2 = 0 < (long)uVar9;
        kVar5 = KTX_SUCCESS;
        uVar9 = uVar9 - 1;
      } while (bVar2);
    }
  }
  return kVar5;
}

Assistant:

KTX_error_code
ktxTexture2_IterateLevels(ktxTexture2* This, PFNKTXITERCB iterCb, void* userdata)
{
    KTX_error_code  result = KTX_SUCCESS;
    //ZSTD_DCtx* dctx;
    //ktx_uint8_t* decompBuf;
    ktxLevelIndexEntry* levelIndex = This->_private->_levelIndex;

    if (This == NULL)
        return KTX_INVALID_VALUE;

    if (iterCb == NULL)
        return KTX_INVALID_VALUE;

    if (This->supercompressionScheme != KTX_SS_NONE)
        return KTX_INVALID_OPERATION;

    for (ktx_int32_t level = This->numLevels - 1; level >= 0; level--)
    {
        ktx_uint32_t width, height, depth;
        ktx_uint64_t levelSize;
        ktx_uint64_t offset;

        /* Array textures have the same number of layers at each mip level. */
        width = MAX(1, This->baseWidth  >> level);
        height = MAX(1, This->baseHeight >> level);
        depth = MAX(1, This->baseDepth  >> level);

        levelSize = levelIndex[level].uncompressedByteLength;
        offset = ktxTexture2_levelDataOffset(This, level);

        /* All array layers are passed in a group because that is how
         * GL & Vulkan need them. Hence no
         *    for (layer = 0; layer < This->numLayers)
         */
        result = iterCb(level, 0, width, height, depth,
                        levelSize, This->pData + offset, userdata);
        if (result != KTX_SUCCESS)
            break;
    }

    return result;
}